

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.h
# Opt level: O0

TextFile * __thiscall asl::TextFile::operator<<(TextFile *this,char *x)

{
  size_t in_RCX;
  void *__buf;
  String local_30;
  char *local_18;
  char *x_local;
  TextFile *this_local;
  
  local_18 = x;
  x_local = (char *)this;
  asl::String::String(&local_30,*x);
  write(this,(int)&local_30,__buf,in_RCX);
  asl::String::~String(&local_30);
  return this;
}

Assistant:

TextFile& operator<<(const T& x) { write(String(x)); return *this; }